

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testIDManifest.cpp
# Opt level: O2

void anon_unknown.dwarf_14c732::doReadWriteManifest(IDManifest *mfst,string *fn,bool dump)

{
  char *pcVar1;
  undefined8 uVar2;
  char cVar3;
  int iVar4;
  undefined4 *puVar5;
  long lVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>_>
  *this;
  Header *pHVar9;
  int *piVar10;
  ostream *poVar11;
  CompressedIDManifest *pCVar12;
  size_type __n;
  vector<char,_std::allocator<char>_> compressed;
  size_t compressedDataSize;
  InputFile in;
  ChannelList chans;
  IDManifest read;
  Header h;
  ostringstream str;
  
  _str = 0;
  Imf_3_2::Header::Header(&h,0x40,0x40,1.0,(Vec2 *)&str,1.0,INCREASING_Y,ZIP_COMPRESSION);
  Imf_3_2::CompressedIDManifest::CompressedIDManifest((CompressedIDManifest *)&str,mfst);
  Imf_3_2::addIDManifest(&h,(CompressedIDManifest *)&str);
  Imf_3_2::CompressedIDManifest::~CompressedIDManifest((CompressedIDManifest *)&str);
  puVar5 = (undefined4 *)Imf_3_2::Header::dataWindow();
  *puVar5 = 0;
  lVar6 = Imf_3_2::Header::dataWindow();
  *(undefined4 *)(lVar6 + 4) = 0;
  lVar6 = Imf_3_2::Header::dataWindow();
  *(undefined4 *)(lVar6 + 8) = 0;
  lVar6 = Imf_3_2::Header::dataWindow();
  *(undefined4 *)(lVar6 + 0xc) = 0;
  puVar7 = (undefined8 *)Imf_3_2::Header::dataWindow();
  puVar8 = (undefined8 *)Imf_3_2::Header::displayWindow();
  *puVar8 = *puVar7;
  puVar8[1] = puVar7[1];
  chans._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &chans._map._M_t._M_impl.super__Rb_tree_header._M_header;
  chans._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  chans._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  chans._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  chans._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       chans._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Imf_3_2::Channel::Channel((Channel *)&str,UINT,1,1,false);
  Imf_3_2::ChannelList::insert((char *)&chans,(Channel *)0x19eabe);
  this = (_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>_>
          *)Imf_3_2::Header::channels();
  std::
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>_>
  ::operator=(this,(_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>_>
                    *)&chans);
  pcVar1 = (fn->_M_dataplus)._M_p;
  iVar4 = Imf_3_2::globalThreadCount();
  Imf_3_2::OutputFile::OutputFile((OutputFile *)&compressed,pcVar1,&h,iVar4);
  read._manifest.
  super__Vector_base<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  read._manifest.
  super__Vector_base<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _in = 1;
  Imf_3_2::Slice::Slice((Slice *)&str,UINT,(char *)&in,1,0,1,1,0.0,false,false);
  Imf_3_2::FrameBuffer::insert((char *)&read,(Slice *)0x19eabe);
  Imf_3_2::OutputFile::setFrameBuffer((FrameBuffer *)&compressed);
  Imf_3_2::OutputFile::writePixels((int)&compressed);
  std::
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
               *)&read);
  Imf_3_2::OutputFile::~OutputFile((OutputFile *)&compressed);
  std::
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>_>
               *)&chans);
  pcVar1 = (fn->_M_dataplus)._M_p;
  iVar4 = Imf_3_2::globalThreadCount();
  Imf_3_2::InputFile::InputFile(&in,pcVar1,iVar4);
  pHVar9 = (Header *)Imf_3_2::InputFile::header();
  piVar10 = (int *)Imf_3_2::idManifest(pHVar9);
  poVar11 = std::operator<<((ostream *)&std::cerr,"compression: ");
  poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
  poVar11 = std::operator<<(poVar11," --> ");
  std::ostream::operator<<(poVar11,*piVar10);
  std::ostream::flush();
  pHVar9 = (Header *)Imf_3_2::InputFile::header();
  pCVar12 = (CompressedIDManifest *)Imf_3_2::idManifest(pHVar9);
  Imf_3_2::IDManifest::IDManifest(&read,pCVar12);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&str);
  operator<<((ostream *)&str,&read);
  poVar11 = std::operator<<((ostream *)&std::cerr," raw decoded size: ");
  std::__cxx11::stringbuf::str();
  poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
  std::operator<<(poVar11,' ');
  std::__cxx11::string::~string((string *)&chans);
  std::__cxx11::stringbuf::str();
  uVar2 = CONCAT44(chans._map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                   chans._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color);
  std::__cxx11::string::~string((string *)&chans);
  __n = exr_compress_max_buffer_size(uVar2);
  compressedDataSize = __n;
  std::vector<char,_std::allocator<char>_>::vector(&compressed,__n,(allocator_type *)&chans);
  std::__cxx11::stringbuf::str();
  exr_compress_buffer(6,chans._map._M_t._M_impl._0_8_,uVar2,
                      compressed.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,__n,&compressedDataSize);
  std::__cxx11::string::~string((string *)&chans);
  poVar11 = std::operator<<((ostream *)&std::cerr,"simple zip size: ");
  poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
  std::operator<<(poVar11,' ');
  std::ostream::flush();
  if (dump) {
    operator<<((ostream *)&std::cout,&read);
  }
  cVar3 = Imf_3_2::IDManifest::operator!=(&read,mfst);
  if (cVar3 != '\0') {
    std::operator<<((ostream *)&std::cerr,"read manifest didn\'t match written manifest\n");
  }
  remove((fn->_M_dataplus)._M_p);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&compressed.super__Vector_base<char,_std::allocator<char>_>);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&str);
  std::
  vector<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
  ::~vector(&read._manifest);
  Imf_3_2::InputFile::~InputFile(&in);
  Imf_3_2::Header::~Header(&h);
  return;
}

Assistant:

void
doReadWriteManifest (const IDManifest& mfst, const string& fn, bool dump)
{
    Header h;
    addIDManifest (h, mfst);
    writeFile (h, fn);

    InputFile in (fn.c_str ());

    const CompressedIDManifest& cmpd = idManifest (in.header ());
    cerr << "compression: " << cmpd._uncompressedDataSize << " --> "
         << cmpd._compressedDataSize;
    cerr.flush ();

    IDManifest read = idManifest (in.header ());

    std::ostringstream str;
    str << read;

    cerr << " raw decoded size: " << str.str ().size () << ' ';

#define COMPARE_WITH_SIMPLE_ZIP
#ifdef COMPARE_WITH_SIMPLE_ZIP
    //
    // allocate a buffer which is guaranteed to be big enough for compression
    //
    size_t       sourceDataSize = str.str ().size ();
    size_t       compressedDataSize = exr_compress_max_buffer_size (sourceDataSize);
    vector<char> compressed (compressedDataSize);

    exr_compress_buffer (
        6,
        str.str ().c_str (),
        sourceDataSize,
        compressed.data (),
        compressedDataSize,
        &compressedDataSize);

    cerr << "simple zip size: " << compressedDataSize << ' ';
#endif

    cerr.flush ();
    if (dump) { cout << read; }
    if (read != mfst)
    {
        cerr << "read manifest didn't match written manifest\n";
        assert (read == mfst);
    }
    remove (fn.c_str ());
}